

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O1

size_t __thiscall
Potassco::ProgramOptions::OptionContext::findGroupKey(OptionContext *this,string *name)

{
  pointer pOVar1;
  pointer __s2;
  size_t sVar2;
  size_t __n;
  int iVar3;
  size_t sVar4;
  long lVar5;
  size_type *psVar6;
  
  pOVar1 = (this->groups_).
           super__Vector_base<Potassco::ProgramOptions::OptionGroup,_std::allocator<Potassco::ProgramOptions::OptionGroup>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(this->groups_).
                super__Vector_base<Potassco::ProgramOptions::OptionGroup,_std::allocator<Potassco::ProgramOptions::OptionGroup>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar1;
  if (lVar5 != 0) {
    __s2 = (name->_M_dataplus)._M_p;
    sVar2 = name->_M_string_length;
    psVar6 = &(pOVar1->caption_)._M_string_length;
    sVar4 = 0;
    do {
      __n = *psVar6;
      if (__n == sVar2) {
        if (__n == 0) {
          return sVar4;
        }
        iVar3 = bcmp((((string *)(psVar6 + -1))->_M_dataplus)._M_p,__s2,__n);
        if (iVar3 == 0) {
          return sVar4;
        }
      }
      sVar4 = sVar4 + 1;
      psVar6 = psVar6 + 8;
    } while (lVar5 >> 6 != sVar4);
  }
  return 0xffffffffffffffff;
}

Assistant:

size_t OptionContext::findGroupKey(const std::string& name) const {
	for (size_t i = 0; i != groups_.size(); ++i) {
		if (groups_[i].caption() == name) { return i; }
	}
	return size_t(-1);
}